

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O0

MatrixXd *
eigs_speed_test(MatrixXd *__return_storage_ptr__,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Nvec,size_t Nrepeats)

{
  value_type vVar1;
  Index IVar2;
  size_type sVar3;
  reference pvVar4;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *this;
  rep rVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_138;
  RowXpr local_130;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> local_f8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d8;
  duration<double,_std::ratio<1L,_1L>_> local_d0;
  double local_c8;
  double elap_us;
  time_point endTime;
  NonConstRealReturnType local_a8;
  int local_94;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_90;
  int i_1;
  time_point startTime;
  double maxeig;
  RandomReturnType local_70;
  undefined1 local_58 [8];
  MatrixXd A;
  size_t i;
  size_type local_30;
  undefined1 local_21;
  size_t local_20;
  size_t Nrepeats_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *Nvec_local;
  MatrixXd *results;
  
  local_21 = 0;
  local_20 = Nrepeats;
  Nrepeats_local = (size_t)Nvec;
  Nvec_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__;
  local_30 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(Nvec);
  i._4_4_ = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_30,(int *)((long)&i + 4))
  ;
  for (A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
      IVar2 = A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)Nrepeats_local),
      (ulong)IVar2 < sVar3;
      A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols + 1)
  {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)Nrepeats_local,
                        A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_cols);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)Nrepeats_local,
                        A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_cols);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(&local_70,vVar1,*pvVar4);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_58,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_70);
    tStack_90.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    for (local_94 = 0; (ulong)(long)local_94 < local_20; local_94 = local_94 + 1) {
      Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvalues
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&endTime);
      Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>::real
                (&local_a8,
                 (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)&endTime);
      startTime.__d.__r =
           (duration)
           Eigen::
           DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>_>
           ::minCoeff((DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
                       *)&local_a8);
      Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<std::complex<double>,__1,_1,_0,__1,_1> *)&endTime);
    }
    elap_us = (double)std::chrono::_V2::system_clock::now();
    local_d8.__r = (rep_conflict)
                   std::chrono::operator-
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)&elap_us,&stack0xffffffffffffff70);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_d0,&local_d8);
    rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_d0);
    auVar7._8_4_ = (int)(local_20 >> 0x20);
    auVar7._0_8_ = local_20;
    auVar7._12_4_ = 0x45300000;
    local_c8 = (rVar5 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0))) *
               1000000.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_130,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)Nrepeats_local,
                        A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_cols);
    vVar1 = *pvVar4;
    auVar6._8_4_ = (int)(vVar1 >> 0x20);
    auVar6._0_8_ = vVar1;
    auVar6._12_4_ = 0x45300000;
    local_138 = (auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    operator<<(&local_f8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               &local_130,&local_138);
    this = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
           operator_(&local_f8,&local_c8);
    Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    operator_(this,(Scalar *)&startTime);
    Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    ~CommaInitializer(&local_f8);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_58)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd eigs_speed_test(std::vector<std::size_t> &Nvec, std::size_t Nrepeats) {
    Eigen::MatrixXd results(Nvec.size(), 3);
    for (std::size_t i = 0; i < Nvec.size(); ++i)
    {
        Eigen::MatrixXd A = Eigen::MatrixXd::Random(Nvec[i], Nvec[i]);
        double maxeig;
        auto startTime = std::chrono::system_clock::now();
        for (int i = 0; i < Nrepeats; ++i) {
            maxeig = A.eigenvalues().real().minCoeff();
        }
        auto endTime = std::chrono::system_clock::now();
        auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / Nrepeats*1e6;
        results.row(i) << static_cast<double>(Nvec[i]), elap_us, maxeig;
    }
    return results;
}